

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O3

void __thiscall
agge::tests::mocks::mask<8ul>::
mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
          (mask<8ul> *this,
          pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*cells) [1],
          int y0)

{
  cell *pcVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  *(int *)(this + 4) = y0;
  *(undefined4 *)(this + 8) = 1;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  std::
  vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::_M_realloc_insert((vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                       *)(this + 0x10),(iterator)0x0,*cells);
  pcVar1 = (*cells)[0].first;
  lVar3 = (long)(*cells)[0].second - (long)pcVar1;
  if (lVar3 == 0) {
    iVar2 = 2;
  }
  else {
    lVar3 = (lVar3 >> 2) * -0x5555555555555555;
    iVar4 = 0x7fffffff;
    do {
      iVar2 = pcVar1->x;
      if (iVar2 <= iVar4) {
        iVar4 = iVar2;
      }
      pcVar1 = pcVar1 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    iVar2 = iVar2 - iVar4;
  }
  iVar4 = -1;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  *(int *)this = iVar4 + 1;
  return;
}

Assistant:

mask(const T (&cells)[n], int y0)
					: _min_y(y0), _height(n)
				{
					int min_x = 0x7FFFFFFF, max_x = -0x7FFFFFFF;

					for (int i = 0; i != n; ++i)
					{
						_cells.push_back(cells[i]);
						for (int j = 0; j != cells[i].second - cells[i].first; ++j)
						{
							min_x = agge_min(min_x, (cells[i].first + j)->x);
							max_x = agge_max(min_x, (cells[i].first + j)->x);
						}
					}
					_width = agge_max(max_x - min_x, -1) + 1;
				}